

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

ElabSystemTaskSyntax * __thiscall
slang::parsing::Parser::parseElabSystemTask(Parser *this,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token name_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  bool bVar1;
  pointer ppAVar2;
  ElabSystemTaskSyntax *pEVar3;
  size_t in_RDI;
  string_view sVar4;
  Token TVar5;
  ArgumentListSyntax *argList;
  Token nameToken;
  string_view name;
  ParserBase *in_stack_fffffffffffffe78;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffe80;
  undefined6 uVar6;
  TokenKind in_stack_fffffffffffffe8e;
  undefined2 uVar7;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe90;
  ParserBase *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  ArgumentListSyntax *pAVar8;
  Parser *in_stack_ffffffffffffff50;
  Parser *local_30;
  
  ParserBase::peek(in_stack_fffffffffffffe78);
  sVar4 = Token::valueText((Token *)in_stack_fffffffffffffe90._M_extent_value);
  local_30 = (Parser *)sVar4._M_len;
  sv((char *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
  __x._M_str = in_stack_fffffffffffffeb0;
  __x._M_len = in_stack_fffffffffffffea8;
  __y._M_str = (char *)in_stack_fffffffffffffea0;
  __y._M_len = in_RDI;
  bVar1 = std::operator==(__x,__y);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    sv((char *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
    __x_00._M_str = in_stack_fffffffffffffeb0;
    __x_00._M_len = in_stack_fffffffffffffea8;
    __y_00._M_str = (char *)in_stack_fffffffffffffea0;
    __y_00._M_len = in_RDI;
    bVar1 = std::operator==(__x_00,__y_00);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      sv((char *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
      __x_01._M_str = in_stack_fffffffffffffeb0;
      __x_01._M_len = in_stack_fffffffffffffea8;
      __y_01._M_str = (char *)in_stack_fffffffffffffea0;
      __y_01._M_len = in_RDI;
      bVar1 = std::operator==(__x_01,__y_01);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        sv((char *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
        __x_02._M_str = in_stack_fffffffffffffeb0;
        __x_02._M_len = in_stack_fffffffffffffea8;
        __y_02._M_str = (char *)in_stack_fffffffffffffea0;
        __y_02._M_len = in_RDI;
        bVar1 = std::operator==(__x_02,__y_02);
        in_stack_ffffffffffffff50 = local_30;
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          sv((char *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
          __x_03._M_str = in_stack_fffffffffffffeb0;
          __x_03._M_len = in_stack_fffffffffffffea8;
          __y_03._M_str = (char *)in_stack_fffffffffffffea0;
          __y_03._M_len = in_RDI;
          bVar1 = std::operator==(__x_03,__y_03);
          in_stack_ffffffffffffff50 = local_30;
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            return (ElabSystemTaskSyntax *)0x0;
          }
        }
      }
    }
  }
  TVar5 = ParserBase::consume(in_stack_fffffffffffffea0);
  pAVar8 = (ArgumentListSyntax *)0x0;
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe90._M_extent_value,
                           in_stack_fffffffffffffe8e);
  if (bVar1) {
    pAVar8 = parseArgumentList(in_stack_ffffffffffffff50);
  }
  ppAVar2 = (pointer)(in_RDI + 0xe0);
  uVar6 = SUB86(ppAVar2,0);
  uVar7 = (undefined2)((ulong)ppAVar2 >> 0x30);
  elements._M_extent._M_extent_value = in_stack_fffffffffffffe90._M_extent_value;
  elements._M_ptr = ppAVar2;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (in_stack_fffffffffffffe80,elements);
  TVar5 = ParserBase::expect(TVar5._0_8_,(TokenKind)((ulong)pAVar8 >> 0x30));
  name_00.rawLen._2_2_ = uVar7;
  name_00._0_6_ = uVar6;
  name_00.info = (Info *)pAVar8;
  pEVar3 = slang::syntax::SyntaxFactory::elabSystemTask
                     ((SyntaxFactory *)TVar5.info,TVar5._0_8_,name_00,(ArgumentListSyntax *)0x302a4c
                      ,TVar5);
  return pEVar3;
}

Assistant:

ElabSystemTaskSyntax* Parser::parseElabSystemTask(AttrList attributes) {
    auto name = peek().valueText();
    if (name != "$fatal"sv && name != "$error"sv && name != "$warning"sv && name != "$info"sv &&
        name != "$static_assert"sv) {
        return nullptr;
    }

    auto nameToken = consume();
    ArgumentListSyntax* argList = nullptr;
    if (peek(TokenKind::OpenParenthesis))
        argList = &parseArgumentList();

    return &factory.elabSystemTask(attributes, nameToken, argList, expect(TokenKind::Semicolon));
}